

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O2

bool __thiscall MemTable::put(MemTable *this,longlong k,string *v)

{
  bool bVar1;
  long lVar2;
  time_t tVar3;
  QuadListNode<SSTableDataEntry> *pred_node;
  Result RVar4;
  string local_50;
  
  RVar4 = skipSearch(this,(this->qlist).
                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,k);
  pred_node = RVar4.node;
  tVar3 = time((time_t *)0x0);
  if (((undefined1  [16])RVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::string((string *)&local_50,(string *)v);
    _put(this,pred_node,k,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
  }
  lVar2 = (pred_node->data).key;
  if (lVar2 == k) {
    bVar1 = (pred_node->data).delete_flag;
    this->_size_bytes = (this->_size_bytes - (pred_node->data).value._M_string_length) - 0x19;
    (pred_node->data).value_length = v->_M_string_length;
    std::__cxx11::string::operator=((string *)&(pred_node->data).value,(string *)v);
    (pred_node->data).timestamp = tVar3;
    this->_size_bytes = (pred_node->data).value._M_string_length + this->_size_bytes + 0x19;
    if (bVar1 == true) {
      do {
        (pred_node->data).delete_flag = false;
        pred_node = pred_node->above;
      } while (pred_node != (QuadListNode<SSTableDataEntry> *)0x0);
    }
  }
  return lVar2 == k;
}

Assistant:

bool MemTable::put(long long k, std::string v) {
    auto[valid, node]=skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k don't exists. Insert new tower.
        _put(node, k, v, false);
    }
    if (node->data.key == k && !node->data.delete_flag) {
        _size_bytes -= size_of_node(node);
        node->data.value_length = v.length();
        node->data.value = std::move(v);
        node->data.timestamp = timestamp;
        _size_bytes += size_of_node(node);
        return true;
    }
    if (node->data.key == k && node->data.delete_flag) {
        // k found, but marked as deleted
        // update value, timestamp and reset delete_flag.
        _size_bytes -= size_of_node(node);
        node->data.value_length = v.length();
        node->data.value = std::move(v);
        node->data.timestamp = timestamp;
        _size_bytes += size_of_node(node);
        do {
            node->data.delete_flag = false;
            node = node->above;
        } while (node != nullptr);
        return true;
    }
    return false;
}